

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u32_sse_harley_seal_improved(uint32_t *array,size_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  undefined1 auVar3 [16];
  size_t i;
  ulong uVar4;
  int j;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 local_98 [16];
  undefined1 auStack_88 [8];
  uint32_t buffer [4];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  for (uVar4 = len & 0xffffffffffffffc0; auVar3 = _DAT_0011e180, uVar4 < len; uVar4 = uVar4 + 1) {
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
      flags[lVar5] = flags[lVar5] + (uint)((array[uVar4] >> ((uint)lVar5 & 0x1f) & 1) != 0);
    }
  }
  auVar36[8] = 0x55;
  auVar36._0_8_ = 0x5555555555555555;
  auVar36[9] = 0x55;
  auVar36[10] = 0x55;
  auVar36[0xb] = 0x55;
  auVar36[0xc] = 0x55;
  auVar36[0xd] = 0x55;
  auVar36[0xe] = 0x55;
  auVar36[0xf] = 0x55;
  auVar37[8] = 1;
  auVar37._0_8_ = 0x101010101010101;
  auVar37[9] = 1;
  auVar37[10] = 1;
  auVar37[0xb] = 1;
  auVar37[0xc] = 1;
  auVar37[0xd] = 1;
  auVar37[0xe] = 1;
  auVar37[0xf] = 1;
  auVar38._8_2_ = 0x3333;
  auVar38._0_8_ = 0x3333333333333333;
  auVar38._10_2_ = 0x3333;
  auVar38._12_2_ = 0x3333;
  auVar38._14_2_ = 0x3333;
  auVar40._8_2_ = 1;
  auVar40._0_8_ = 0x1000100010001;
  auVar40._10_2_ = 1;
  auVar40._12_2_ = 1;
  auVar40._14_2_ = 1;
  auVar41._8_4_ = 0xf;
  auVar41._0_8_ = 0xf0000000f;
  auVar41._12_4_ = 0xf;
  auVar24 = vpmovsxbd_avx512f(_DAT_0011e190);
  auVar25 = vpmovsxbd_avx512f(_DAT_0011e1a0);
  auVar26 = vpmovsxbd_avx512f(_DAT_0011e1b0);
  auVar27 = vpmovsxbd_avx512f(_DAT_0011e100);
  auVar28 = vpmovsxbd_avx512f(_DAT_0011e0d0);
  auVar44 = ZEXT1664((undefined1  [16])0x0);
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  auVar42 = ZEXT1664((undefined1  [16])0x0);
  auVar43 = ZEXT1664((undefined1  [16])0x0);
  uVar4 = 0;
  uVar6 = len >> 2 & 0xfffffffffffffff0;
  while (uVar4 < uVar6) {
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
      *(undefined8 *)(auStack_88 + lVar5) = 0;
      *(undefined8 *)((long)buffer + lVar5) = 0;
    }
    auVar10 = vmovdqa64_avx512vl(_auStack_88);
    auVar11 = vmovdqa64_avx512vl(stack0xffffffffffffff88);
    auVar12 = vmovdqa64_avx512vl(local_68);
    auVar13 = vmovdqa64_avx512vl(local_58);
    uVar8 = uVar4 + 0xffff;
    if (uVar6 - uVar4 < 0x10000) {
      uVar8 = uVar6;
    }
    pauVar9 = (undefined1 (*) [16])(array + uVar4 * 4 + 0x3c);
    while (auVar14 = vpshufb_avx512vl(auVar44._0_16_,auVar3), uVar4 < uVar8) {
      auVar15 = vmovdqu64_avx512vl(pauVar9[-0xe]);
      auVar16 = vmovdqu64_avx512vl(pauVar9[-0xd]);
      auVar17 = vmovdqu64_avx512vl(pauVar9[-0xc]);
      uVar4 = uVar4 + 0x10;
      auVar18 = vpxorq_avx512vl(pauVar9[-0xf],auVar43._0_16_);
      auVar19 = vpandq_avx512vl(auVar18,auVar15);
      auVar19 = vpternlogq_avx512vl(auVar19,pauVar9[-0xf],auVar43._0_16_,0xf8);
      auVar15 = vpxorq_avx512vl(auVar18,auVar15);
      auVar18 = vpxorq_avx512vl(auVar15,auVar16);
      auVar20 = vpandq_avx512vl(auVar18,auVar17);
      auVar15 = vpternlogq_avx512vl(auVar20,auVar15,auVar16,0xf8);
      auVar16 = vpxorq_avx512vl(auVar18,auVar17);
      auVar17 = vpxorq_avx512vl(auVar19,auVar42._0_16_);
      auVar18 = vpandq_avx512vl(auVar15,auVar17);
      auVar18 = vpternlogq_avx512vl(auVar18,auVar19,auVar42._0_16_,0xf8);
      auVar15 = vpxorq_avx512vl(auVar15,auVar17);
      auVar17 = vmovdqu64_avx512vl(pauVar9[-10]);
      auVar19 = vpxorq_avx512vl(auVar16,pauVar9[-0xb]);
      auVar20 = vpandq_avx512vl(auVar19,auVar17);
      auVar16 = vpternlogq_avx512vl(auVar20,auVar16,pauVar9[-0xb],0xf8);
      auVar17 = vpxorq_avx512vl(auVar19,auVar17);
      auVar19 = vmovdqu64_avx512vl(pauVar9[-8]);
      auVar20 = vpxorq_avx512vl(auVar17,pauVar9[-9]);
      auVar21 = vpandq_avx512vl(auVar20,auVar19);
      auVar17 = vpternlogq_avx512vl(auVar21,auVar17,pauVar9[-9],0xf8);
      auVar21 = vpxorq_avx512vl(auVar16,auVar15);
      auVar19 = vpxorq_avx512vl(auVar20,auVar19);
      auVar20 = vpandq_avx512vl(auVar17,auVar21);
      auVar15 = vpternlogq_avx512vl(auVar20,auVar16,auVar15,0xf8);
      auVar16 = vpxorq_avx512vl(auVar17,auVar21);
      auVar17 = vpxorq_avx512vl(auVar18,auVar39._0_16_);
      auVar20 = vpandq_avx512vl(auVar15,auVar17);
      auVar18 = vpternlogq_avx512vl(auVar20,auVar18,auVar39._0_16_,0xf8);
      auVar15 = vpxorq_avx512vl(auVar15,auVar17);
      auVar17 = vmovdqu64_avx512vl(pauVar9[-6]);
      auVar20 = vpxorq_avx512vl(auVar19,pauVar9[-7]);
      auVar21 = vpandq_avx512vl(auVar20,auVar17);
      auVar19 = vpternlogq_avx512vl(auVar21,auVar19,pauVar9[-7],0xf8);
      auVar17 = vpxorq_avx512vl(auVar20,auVar17);
      auVar20 = vmovdqu64_avx512vl(pauVar9[-4]);
      auVar21 = vpxorq_avx512vl(auVar17,pauVar9[-5]);
      auVar22 = vpandq_avx512vl(auVar21,auVar20);
      auVar17 = vpternlogq_avx512vl(auVar22,auVar17,pauVar9[-5],0xf8);
      auVar22 = vpxorq_avx512vl(auVar19,auVar16);
      auVar20 = vpxorq_avx512vl(auVar21,auVar20);
      auVar21 = vmovdqu64_avx512vl(pauVar9[-2]);
      auVar23 = vpandq_avx512vl(auVar17,auVar22);
      auVar16 = vpternlogq_avx512vl(auVar23,auVar19,auVar16,0xf8);
      auVar17 = vpxorq_avx512vl(auVar17,auVar22);
      auVar19 = vpxorq_avx512vl(auVar20,pauVar9[-3]);
      auVar22 = vpandq_avx512vl(auVar19,auVar21);
      auVar20 = vpternlogq_avx512vl(auVar22,auVar20,pauVar9[-3],0xf8);
      pauVar1 = pauVar9 + -1;
      auVar19 = vpxorq_avx512vl(auVar19,auVar21);
      auVar21 = vmovdqu64_avx512vl(*pauVar9);
      pauVar9 = pauVar9 + 0x10;
      auVar22 = vpxorq_avx512vl(auVar19,*pauVar1);
      auVar23 = vpandq_avx512vl(auVar22,auVar21);
      auVar19 = vpternlogq_avx512vl(auVar23,auVar19,*pauVar1,0xf8);
      auVar23 = vpxorq_avx512vl(auVar20,auVar17);
      auVar21 = vpxorq_avx512vl(auVar22,auVar21);
      auVar43 = ZEXT1664(auVar21);
      auVar21 = vpandq_avx512vl(auVar19,auVar23);
      auVar17 = vpternlogq_avx512vl(auVar21,auVar20,auVar17,0xf8);
      auVar19 = vpxorq_avx512vl(auVar19,auVar23);
      auVar42 = ZEXT1664(auVar19);
      auVar19 = vpxorq_avx512vl(auVar16,auVar15);
      auVar20 = vpandq_avx512vl(auVar17,auVar19);
      auVar15 = vpternlogq_avx512vl(auVar20,auVar16,auVar15,0xf8);
      auVar16 = vpxorq_avx512vl(auVar17,auVar19);
      auVar39 = ZEXT1664(auVar16);
      auVar16 = vpsrld_avx512vl(auVar14,1);
      auVar17 = vpandq_avx512vl(auVar14,auVar36);
      auVar14 = vpand_avx(auVar16,auVar36);
      auVar16 = vpmaddubsw_avx512vl(auVar17,auVar37);
      auVar14 = vpmaddubsw_avx(auVar14,auVar37);
      auVar14 = vpslld_avx(auVar14,8);
      auVar14 = vporq_avx512vl(auVar14,auVar16);
      auVar16 = vpsrld_avx512vl(auVar14,2);
      auVar14 = vpand_avx(auVar14,auVar38);
      auVar14 = vpmaddwd_avx(auVar14,auVar40);
      auVar16 = vpandq_avx512vl(auVar16,auVar38);
      auVar16 = vpmaddwd_avx512vl(auVar16,auVar40);
      auVar17 = vpandd_avx512vl(auVar14,auVar41);
      auVar10 = vpaddd_avx512vl(auVar10,auVar17);
      auVar17 = vpsrld_avx512vl(auVar14,4);
      auVar17 = vpandd_avx512vl(auVar17,auVar41);
      auVar11 = vpaddd_avx512vl(auVar11,auVar17);
      auVar17 = vpsrld_avx512vl(auVar14,8);
      auVar14 = vpsrld_avx(auVar14,0xc);
      auVar13 = vpaddd_avx512vl(auVar13,auVar14);
      auVar14 = vpandd_avx512vl(auVar16,auVar41);
      auVar17 = vpandd_avx512vl(auVar17,auVar41);
      local_48 = vpaddd_avx(local_48,auVar14);
      auVar14 = vpsrld_avx512vl(auVar16,4);
      auVar12 = vpaddd_avx512vl(auVar12,auVar17);
      auVar14 = vpand_avx(auVar14,auVar41);
      local_38 = vpaddd_avx(local_38,auVar14);
      auVar14 = vpsrld_avx512vl(auVar16,8);
      auVar14 = vpand_avx(auVar14,auVar41);
      local_28 = vpaddd_avx(local_28,auVar14);
      auVar14 = vpsrld_avx512vl(auVar16,0xc);
      auVar16 = vpxorq_avx512vl(auVar18,auVar35._0_16_);
      local_18 = vpaddd_avx(local_18,auVar14);
      auVar14 = vpandq_avx512vl(auVar15,auVar16);
      auVar14 = vpternlogq_avx512vl(auVar14,auVar18,auVar35._0_16_,0xf8);
      auVar44 = ZEXT1664(auVar14);
      auVar14 = vpxorq_avx512vl(auVar15,auVar16);
      auVar35 = ZEXT1664(auVar14);
    }
    auVar15 = vpsrld_avx512vl(auVar14,1);
    auVar14 = vpandq_avx512vl(auVar14,auVar36);
    auVar29 = vpmovsxbd_avx512f(_DAT_0011e1c0);
    auVar15 = vpandq_avx512vl(auVar15,auVar36);
    auVar14 = vpmaddubsw_avx512vl(auVar14,auVar37);
    auVar15 = vpmaddubsw_avx512vl(auVar15,auVar37);
    auVar15 = vpslld_avx512vl(auVar15,8);
    auVar14 = vporq_avx512vl(auVar15,auVar14);
    auVar15 = vpandq_avx512vl(auVar14,auVar38);
    auVar14 = vpsrld_avx512vl(auVar14,2);
    auVar15 = vpmaddwd_avx512vl(auVar15,auVar40);
    auVar14 = vpandq_avx512vl(auVar14,auVar38);
    auVar14 = vpmaddwd_avx512vl(auVar14,auVar40);
    auVar16 = vpandd_avx512vl(auVar15,auVar41);
    auVar10 = vpaddd_avx512vl(auVar10,auVar16);
    auVar16 = vpsrld_avx512vl(auVar15,4);
    auVar16 = vpandd_avx512vl(auVar16,auVar41);
    _auStack_88 = vmovdqa64_avx512vl(auVar10);
    auVar10 = vpslld_avx512vl(auVar10,4);
    auVar11 = vpaddd_avx512vl(auVar11,auVar16);
    auVar16 = vpsrld_avx512vl(auVar15,8);
    auVar15 = vpsrld_avx512vl(auVar15,0xc);
    auVar16 = vpandd_avx512vl(auVar16,auVar41);
    auVar13 = vpaddd_avx512vl(auVar13,auVar15);
    auVar15 = vpandd_avx512vl(auVar14,auVar41);
    unique0x00006c80 = vmovdqa64_avx512vl(auVar11);
    auVar12 = vpaddd_avx512vl(auVar12,auVar16);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011e1d0);
    local_48 = vpaddd_avx512vl(local_48,auVar15);
    auVar15 = vpsrld_avx512vl(auVar14,4);
    auVar15 = vpandd_avx512vl(auVar15,auVar41);
    local_68 = vmovdqa64_avx512vl(auVar12);
    auVar12 = vpslld_avx512vl(auVar12,4);
    local_58 = vmovdqa64_avx512vl(auVar13);
    auVar16 = vpslld_avx(local_48,4);
    auVar47 = ZEXT1664(auVar16);
    auVar13 = vpslld_avx512vl(auVar13,4);
    auVar48 = ZEXT1664(auVar13);
    local_38 = vpaddd_avx512vl(local_38,auVar15);
    auVar13 = vpsrld_avx512vl(auVar14,8);
    auVar14 = vpsrld_avx512vl(auVar14,0xc);
    auVar14 = vpaddd_avx512vl(local_18,auVar14);
    auVar31 = vmovdqa64_avx512f(ZEXT1664(auVar10));
    auVar13 = vpandd_avx512vl(auVar13,auVar41);
    auVar29 = vpermt2d_avx512f(auVar31,auVar29,ZEXT1664(auVar12));
    auVar15 = vpslld_avx(local_38,4);
    auVar46 = ZEXT1664(auVar15);
    local_28 = vpaddd_avx512vl(local_28,auVar13);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e1e0);
    auVar13 = vpslld_avx(local_28,4);
    auVar45 = ZEXT1664(auVar13);
    local_18 = vmovdqa64_avx512vl(auVar14);
    auVar30 = vpermt2d_avx512f(ZEXT1664(auVar10),auVar30,ZEXT1664(auVar12));
    auVar32 = vpmovsxbd_avx512f(_DAT_0011e1f0);
    auVar11 = vpslld_avx512vl(auVar11,4);
    auVar49 = ZEXT1664(auVar11);
    auVar12 = vpslld_avx512vl(auVar14,4);
    auVar50 = ZEXT1664(auVar12);
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x400090100));
    auVar34 = vmovdqa64_avx512f(auVar47);
    auVar34._0_8_ = auVar29._0_8_;
    auVar34._16_8_ = auVar29._16_8_;
    auVar34._24_8_ = auVar29._24_8_;
    auVar34._32_8_ = auVar29._32_8_;
    auVar34._40_8_ = auVar29._40_8_;
    auVar34._48_8_ = auVar29._48_8_;
    auVar34._56_8_ = auVar29._56_8_;
    auVar29 = vpunpcklqdq_avx512f(auVar30,auVar47);
    auVar29 = vpermt2d_avx512f(auVar29,auVar32,auVar45);
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x408020100));
    auVar29 = vinserti32x4_avx512f(auVar29,auVar11,1);
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar48);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e200);
    auVar29 = vpermt2q_avx512f(auVar29,auVar30,auVar46);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011e0e0);
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar50);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e0b0);
    auVar29 = vpermt2d_avx512f(auVar29,auVar30,auVar47);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011e210);
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar45);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e220);
    auVar29 = vpermt2d_avx512f(auVar29,auVar30,auVar49);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011e230);
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar48);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e240);
    auVar29 = vpermt2d_avx512f(auVar29,auVar30,auVar46);
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar50);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011e250);
    auVar29 = vpaddd_avx512f(auVar29,*(undefined1 (*) [64])flags);
    auVar30 = vpermt2d_avx512f(auVar34,auVar30,auVar45);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e260);
    auVar29 = vmovdqu64_avx512f(auVar29);
    *(undefined1 (*) [64])flags = auVar29;
    auVar29 = vpermt2q_avx512f(auVar30,auVar33,auVar49);
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x409020100));
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar48);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011e270);
    auVar29 = vpermt2q_avx512f(auVar29,auVar30,auVar46);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011e280);
    auVar29 = vpermt2d_avx512f(auVar29,auVar31,auVar50);
    auVar29 = vpermt2d_avx512f(auVar29,auVar30,auVar47);
    auVar29 = vpermt2d_avx512f(auVar29,auVar24,auVar45);
    auVar29 = vpermt2d_avx512f(auVar29,auVar25,auVar49);
    auVar29 = vpermt2d_avx512f(auVar29,auVar26,auVar48);
    auVar29 = vpermt2d_avx512f(auVar29,auVar27,auVar46);
    auVar29 = vpermt2d_avx512f(auVar29,auVar28,auVar50);
    auVar29 = vpaddd_avx512f(auVar29,*(undefined1 (*) [64])(flags + 0x10));
    auVar29 = vmovdqu64_avx512f(auVar29);
    *(undefined1 (*) [64])(flags + 0x10) = auVar29;
  }
  local_98 = auVar43._0_16_;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    uVar2 = *(uint *)(local_98 + lVar5 * 4);
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  local_98 = auVar42._0_16_;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    uVar2 = *(uint *)(local_98 + lVar5 * 4);
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + ((uVar2 >> ((uint)lVar7 & 0x1f)) * 2 & 2);
    }
  }
  local_98 = auVar39._0_16_;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    uVar2 = *(uint *)(local_98 + lVar5 * 4);
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uVar2 >> ((uint)lVar7 & 0x1f) & 1) * 4;
    }
  }
  local_98 = auVar35._0_16_;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    uVar2 = *(uint *)(local_98 + lVar5 * 4);
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uVar2 >> ((uint)lVar7 & 0x1f) & 1) * 8;
    }
  }
  return;
}

Assistant:

void pospopcnt_u32_sse_harley_seal_improved(const uint32_t* array, size_t len, uint32_t* flags) {
    for (size_t i = len - (len % (16 * 4)); i < len; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 4;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint32_t buffer[4];
    __m128i counter[8];

    const __m128i lookup = _mm_setr_epi8( 0,  4,  8, 12,
                                          1,  5,  9, 13,
                                          2,  6, 10, 14,
                                          3,  7, 11, 15);

    while (i < limit) {
        for (size_t i = 0; i < 8; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);

            {
                const __m128i t0 = _mm_shuffle_epi8(v16, lookup);
                const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
                const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

                const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
                const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

                const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

                const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
                const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

                const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
                const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

                const __m128i mask = _mm_set1_epi32(0x0000000f);
                counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
                counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
                counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
                counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
                counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
                counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
                counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
                counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));
            }

            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
        }

        // update the counters after the last iteration
        {
            const __m128i t0 = _mm_shuffle_epi8(v16, lookup);

            const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
            const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

            const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
            const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

            const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

            const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
            const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

            const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
            const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

            const __m128i mask = _mm_set1_epi32(0x0000000f);
            counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
            counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
            counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
            counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
            counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
            counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
            counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
            counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));

#define update_flags(counterN, index0, index1, index2, index3)      \
            _mm_storeu_si128((__m128i*)buffer, _mm_slli_epi32(counterN, 4));           \
            flags[index0] += buffer[0]; flags[index1] += buffer[1]; \
            flags[index2] += buffer[2]; flags[index3] += buffer[3];

            update_flags(counter[0], 0,  8, 16, 24);
            update_flags(counter[1], 4, 12, 20, 28);
            update_flags(counter[2], 1,  9, 17, 25);
            update_flags(counter[3], 5, 13, 21, 29);
            update_flags(counter[4], 2, 10, 18, 26);
            update_flags(counter[5], 6, 14, 22, 30);
            update_flags(counter[6], 3, 11, 19, 27);
            update_flags(counter[7], 7, 15, 23, 31);
#undef update_flags
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
}